

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

void __thiscall absl::lts_20250127::log_internal::LogMessage::Flush(LogMessage *this)

{
  bool bVar1;
  LogSeverity LVar2;
  LogSeverityAtLeast rhs;
  uint uVar3;
  int v;
  pointer pLVar4;
  LogMessage *pLVar5;
  pointer __str;
  Span<char> *this_00;
  pointer pcVar6;
  pointer pvVar7;
  int errnum;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  bool local_3d [8];
  bool expected_seen_fatal;
  string local_30;
  LogMessage *local_10;
  LogMessage *this_local;
  
  local_10 = this;
  pLVar4 = std::
           unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ::operator->(&this->data_);
  LVar2 = LogEntry::log_severity(&pLVar4->entry);
  rhs = MinLogLevel();
  bVar1 = lts_20250127::operator<(LVar2,rhs);
  if (!bVar1) {
    pLVar4 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    if ((pLVar4->is_perror & 1U) != 0) {
      pLVar5 = InternalStream(this);
      pLVar5 = operator<<(pLVar5,(char (*) [3])0x7b7532);
      uVar3 = base_internal::ErrnoSaver::operator()(&this->errno_saver_);
      base_internal::StrError_abi_cxx11_(&local_30,(base_internal *)(ulong)uVar3,errnum);
      pLVar5 = operator<<(pLVar5,&local_30);
      pLVar5 = operator<<(pLVar5,(char (*) [3])0x8166ee);
      v = base_internal::ErrnoSaver::operator()(&this->errno_saver_);
      pLVar5 = operator<<(pLVar5,v);
      operator<<(pLVar5,(char (*) [2])0x831456);
      std::__cxx11::string::~string((string *)&local_30);
    }
    pLVar4 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    LVar2 = LogEntry::log_severity(&pLVar4->entry);
    if ((LVar2 == kFatal) && (bVar1 = ExitOnDFatal(), bVar1)) {
      local_3d[0] = false;
      bVar1 = std::atomic<bool>::compare_exchange_strong
                        (&Flush::seen_fatal,local_3d,true,memory_order_relaxed);
      if (bVar1) {
        pLVar4 = std::
                 unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                 ::operator->(&this->data_);
        pLVar4->first_fatal = true;
      }
    }
    pLVar4 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    LogMessageData::FinalizeEncodingAndFormat(pLVar4);
    pLVar4 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    __str = std::array<char,_15000UL>::data(&pLVar4->encoded_buf);
    pLVar4 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    this_00 = LogMessageData::encoded_remaining(pLVar4);
    pcVar6 = Span<char>::data(this_00);
    pLVar4 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    pvVar7 = std::array<char,_15000UL>::data(&pLVar4->encoded_buf);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_50,__str,(long)pcVar6 - (long)pvVar7);
    pLVar4 = std::
             unique_ptr<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    (pLVar4->entry).encoding_._M_len = local_50._M_len;
    (pLVar4->entry).encoding_._M_str = local_50._M_str;
    SendToLog(this);
  }
  return;
}

Assistant:

void LogMessage::Flush() {
  if (data_->entry.log_severity() < absl::MinLogLevel()) return;

  if (data_->is_perror) {
    InternalStream() << ": " << absl::base_internal::StrError(errno_saver_())
                     << " [" << errno_saver_() << "]";
  }

  // Have we already seen a fatal message?
  ABSL_CONST_INIT static std::atomic<bool> seen_fatal(false);
  if (data_->entry.log_severity() == absl::LogSeverity::kFatal &&
      absl::log_internal::ExitOnDFatal()) {
    // Exactly one LOG(FATAL) message is responsible for aborting the process,
    // even if multiple threads LOG(FATAL) concurrently.
    bool expected_seen_fatal = false;
    if (seen_fatal.compare_exchange_strong(expected_seen_fatal, true,
                                           std::memory_order_relaxed)) {
      data_->first_fatal = true;
    }
  }

  data_->FinalizeEncodingAndFormat();
  data_->entry.encoding_ =
      absl::string_view(data_->encoded_buf.data(),
                        static_cast<size_t>(data_->encoded_remaining().data() -
                                            data_->encoded_buf.data()));
  SendToLog();
}